

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filescan.cc
# Opt level: O3

RC __thiscall
RM_FileScan::OpenScan
          (RM_FileScan *this,RM_FileHandle *fileHandle,AttrType attrType,int attrLength,
          int attrOffset,CompOp compOp,void *value,ClientHint pinHint)

{
  bool bVar1;
  int iVar2;
  RC RVar3;
  undefined4 *puVar4;
  void *__dest;
  
  if (this->openScan != false) {
    return 0x6c;
  }
  bVar1 = RM_FileHandle::isValidFileHeader(fileHandle);
  if (!bVar1) {
    return 0x6a;
  }
  this->fileHandle = fileHandle;
  this->value = (void *)0x0;
  this->compOp = compOp;
  if (compOp < (GE_OP|EQ_OP)) {
    this->comparator =
         *(_func_bool_void_ptr_void_ptr_AttrType_int **)(&DAT_00127b58 + (ulong)compOp * 8);
    iVar2 = RM_FileHandle::getRecordSize(fileHandle);
    if (this->compOp != NO_OP) {
      if ((0xff < (uint)attrOffset) || (iVar2 < attrOffset + attrLength)) goto LAB_0011a9b2;
      this->attrOffset = attrOffset;
      this->attrLength = attrLength;
      if (attrType < STRING) {
        if (attrLength != 4) {
          return 0x6c;
        }
        puVar4 = (undefined4 *)malloc(4);
        this->value = puVar4;
        *puVar4 = *value;
      }
      else {
        if (attrType != STRING) {
          return 0x6c;
        }
        __dest = malloc((long)attrLength);
        this->value = __dest;
        memcpy(__dest,value,(long)attrLength);
      }
      this->initializedValue = true;
      this->attrType = attrType;
    }
    this->openScan = true;
    this->scanEnded = false;
    this->numRecOnPage = 0;
    this->numSeenOnPage = 0;
    this->useNextPage = true;
    this->hasPagePinned = false;
    this->scanPage = 0;
    this->scanSlot = -1;
    RVar3 = 0;
  }
  else {
LAB_0011a9b2:
    RVar3 = 0x6c;
  }
  return RVar3;
}

Assistant:

RC RM_FileScan::OpenScan (const RM_FileHandle &fileHandle,
                  AttrType   attrType,
                  int        attrLength,
                  int        attrOffset,
                  CompOp     compOp,
                  void       *value,
                  ClientHint pinHint) {
  // If this is already associated with a scan, return immediately as an error
  if (openScan == true)
    return (RM_INVALIDSCAN);

  // Check that the fileHandle is valid
  if(fileHandle.isValidFileHeader())
    this->fileHandle = const_cast<RM_FileHandle*>(&fileHandle);
  else
    return (RM_INVALIDFILE);

  this->value = NULL;
  // Set the comparator to the appropriate function
  this->compOp = compOp;
  switch(compOp){
    case EQ_OP : comparator = &equal; break;
    case LT_OP : comparator = &less_than; break;
    case GT_OP : comparator = &greater_than; break;
    case LE_OP : comparator = &less_than_or_eq_to; break;
    case GE_OP : comparator = &greater_than_or_eq_to; break;
    case NE_OP : comparator = &not_equal; break;
    case NO_OP : comparator = NULL; break;
    default: return (RM_INVALIDSCAN);
  }

  int recSize = (this->fileHandle)->getRecordSize();
  // If there is a comparison, update the comparison parameters.
  if(this->compOp != NO_OP){
    // Check that the attribute offset and sizes are compatible with given
    // FileHandle
    if((attrOffset + attrLength) > recSize || attrOffset < 0 || attrOffset > MAXSTRINGLEN)
      return (RM_INVALIDSCAN);
    this->attrOffset = attrOffset;
    this->attrLength = attrLength;

    // Allocate the appropraite memory to store the value being compared
    if(attrType == FLOAT || attrType == INT){
      if(attrLength != 4)
        return (RM_INVALIDSCAN);
      this->value = (void *) malloc(4);
      memcpy(this->value, value, 4);
      initializedValue = true;
    }
    else if(attrType == STRING){
      this->value = (void *) malloc(attrLength);
      memcpy(this->value, value, attrLength);
      initializedValue = true;
    }
    else{
      return (RM_INVALIDSCAN);
    }
    this->attrType = attrType;
  }

  // open the scan
  openScan = true;
  scanEnded = false;

  // set up scan parameters:
  numRecOnPage = 0;
  numSeenOnPage = 0;
  useNextPage = true;
  scanPage = 0;
  scanSlot = BEGIN_SCAN;
  numSeenOnPage = 0;
  hasPagePinned = false;
  return (0);
}